

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

void __thiscall cppnet::Address::Address(Address *this,AddressType at)

{
  this->_address_type = at;
  (this->_ip)._M_dataplus._M_p = (pointer)&(this->_ip).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_ip,"");
  this->_port = 0;
  return;
}

Assistant:

Address::Address(AddressType at):
    _address_type(at),    
    _ip(""),           
    _port(0) {
    
}